

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PedestriansWalkingAnEight.cpp
# Opt level: O0

Vec3 __thiscall
anon_unknown.dwarf_70a26::Pedestrian::determineCombinedSteering(Pedestrian *this,float elapsedTime)

{
  bool bVar1;
  Vec3 *in_RDI;
  float fVar2;
  undefined4 uVar3;
  Vec3 VVar4;
  AVGroup *in_stack_00000030;
  float in_stack_0000003c;
  SteerLibraryMixin<OpenSteer::AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>_>
  *in_stack_00000040;
  Vec3 pathFollow;
  float pfLeadTime;
  float maxRadius;
  float caLeadTime;
  Vec3 collisionAvoidance;
  float oTime;
  Vec3 obstacleAvoidance;
  float leakThrough;
  Vec3 steeringForce;
  Vec3 *in_stack_fffffffffffffdc8;
  Vec3 *v;
  float in_stack_fffffffffffffddc;
  undefined4 in_stack_fffffffffffffde0;
  undefined4 in_stack_fffffffffffffde4;
  undefined4 in_stack_fffffffffffffdf0;
  undefined4 in_stack_fffffffffffffdf4;
  float in_stack_fffffffffffffdfc;
  undefined4 in_stack_fffffffffffffe00;
  undefined4 in_stack_fffffffffffffe04;
  undefined4 in_stack_fffffffffffffe08;
  undefined4 in_stack_fffffffffffffe0c;
  undefined4 in_stack_fffffffffffffe10;
  undefined4 in_stack_fffffffffffffe14;
  undefined4 in_stack_fffffffffffffe50;
  undefined4 in_stack_fffffffffffffe54;
  undefined8 in_stack_fffffffffffffe58;
  float predictionTime;
  undefined4 in_stack_fffffffffffffe60;
  float in_stack_fffffffffffffe7c;
  undefined4 in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe84;
  float local_170;
  float in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffea4;
  float in_stack_fffffffffffffea8;
  int in_stack_fffffffffffffeac;
  undefined4 in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb4;
  Vec3 local_118 [4];
  Vec3 local_e8;
  undefined8 local_d8;
  undefined4 local_d0;
  undefined8 local_c8;
  undefined4 local_c0;
  float local_bc;
  undefined4 local_b8;
  Vec3 local_b4;
  Vec3 local_a8;
  undefined8 local_94;
  float local_8c;
  Vec3 local_88;
  undefined8 local_74;
  float local_6c;
  Vec3 local_68;
  Vec3 local_58;
  undefined4 local_4c;
  Vec3 local_48;
  undefined4 local_3c;
  undefined8 local_38;
  undefined8 local_28;
  
  predictionTime = (float)((ulong)in_stack_fffffffffffffe58 >> 0x20);
  local_38 = (**(code **)(*(long *)in_RDI + 0x30))();
  local_3c = 0x3dcccccd;
  local_28 = local_38;
  OpenSteer::Vec3::Vec3(&local_48);
  fVar2 = OpenSteer::frandom01();
  local_170 = in_stack_fffffffffffffea0;
  if (0.1 < fVar2) {
    local_4c = 0x40c00000;
    VVar4 = OpenSteer::
            SteerLibraryMixin<OpenSteer::AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>_>
            ::steerToAvoidObstacles
                      ((SteerLibraryMixin<OpenSteer::AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>_>
                        *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                       in_stack_fffffffffffffdfc,
                       (ObstacleGroup *)
                       CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0));
    local_68.z = VVar4.z;
    local_58.z = local_68.z;
    local_68._0_8_ = VVar4._0_8_;
    local_58.x = local_68.x;
    local_58.y = local_68.y;
    local_68 = VVar4;
    VVar4 = OpenSteer::Vec3::operator=(&local_48,&local_58);
    local_88._0_8_ = VVar4._0_8_;
    local_74._0_4_ = local_88.x;
    local_74._4_4_ = local_88.y;
    local_88.z = VVar4.z;
    local_6c = local_88.z;
    local_170 = in_stack_fffffffffffffea0;
    local_88 = VVar4;
  }
  bVar1 = OpenSteer::Vec3::operator!=(in_RDI,in_stack_fffffffffffffdc8);
  if (bVar1) {
    VVar4 = OpenSteer::Vec3::operator+=
                      ((Vec3 *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                       (Vec3 *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
    local_a8._0_8_ = VVar4._0_8_;
    local_94._0_4_ = local_a8.x;
    local_94._4_4_ = local_a8.y;
    local_a8.z = VVar4.z;
    local_8c = local_a8.z;
    local_a8 = VVar4;
  }
  else {
    OpenSteer::Vec3::Vec3(&local_b4);
    local_b8 = 0x40400000;
    fVar2 = (float)(**(code **)(*(long *)in_RDI + 0x100))();
    uVar3 = 0x40400000;
    local_bc = fVar2 * 3.0 + fVar2 * 3.0;
    std::vector<OpenSteer::AbstractVehicle_*,_std::allocator<OpenSteer::AbstractVehicle_*>_>::clear
              ((vector<OpenSteer::AbstractVehicle_*,_std::allocator<OpenSteer::AbstractVehicle_*>_>
                *)0x1546fd);
    v = *(Vec3 **)&in_RDI[0x13].y;
    local_d8 = (**(code **)(*(long *)in_RDI + 0x40))();
    local_d0 = uVar3;
    local_c8 = local_d8;
    local_c0 = uVar3;
    (**(code **)(*(long *)v + 0x18))
              (local_bc,v,&local_c8,(anonymous_namespace)::Pedestrian::neighbors);
    fVar2 = OpenSteer::frandom01();
    if (0.1 < fVar2) {
      OpenSteer::
      SteerLibraryMixin<OpenSteer::AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>_>
      ::steerToAvoidNeighbors(in_stack_00000040,in_stack_0000003c,in_stack_00000030);
      VVar4 = OpenSteer::Vec3::operator*
                        ((Vec3 *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
                         in_stack_fffffffffffffddc);
      local_118[0].z = VVar4.z;
      local_e8.z = local_118[0].z;
      local_118[0]._0_8_ = VVar4._0_8_;
      local_e8.x = local_118[0].x;
      local_e8.y = local_118[0].y;
      OpenSteer::Vec3::operator=(&local_b4,&local_e8);
    }
    bVar1 = OpenSteer::Vec3::operator!=(in_RDI,v);
    if (bVar1) {
      OpenSteer::Vec3::operator+=
                ((Vec3 *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                 (Vec3 *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
    }
    else {
      if (((anonymous_namespace)::gWanderSwitch & 1) != 0) {
        VVar4 = OpenSteer::
                SteerLibraryMixin<OpenSteer::AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>_>
                ::steerForWander((SteerLibraryMixin<OpenSteer::AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>_>
                                  *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                                 in_stack_fffffffffffffe7c);
        local_170 = VVar4.z;
        OpenSteer::Vec3::operator+=
                  ((Vec3 *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                   (Vec3 *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
      }
      if (((anonymous_namespace)::gUseDirectedPathFollowing & 1) == 0) {
        OpenSteer::
        SteerLibraryMixin<OpenSteer::AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>_>
        ::steerToStayOnPath((SteerLibraryMixin<OpenSteer::AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>_>
                             *)CONCAT44(0x40400000,in_stack_fffffffffffffe60),predictionTime,
                            (Pathway *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50)
                           );
      }
      else {
        OpenSteer::
        SteerLibraryMixin<OpenSteer::AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>_>
        ::steerToFollowPath((SteerLibraryMixin<OpenSteer::AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>_>
                             *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                            in_stack_fffffffffffffeac,in_stack_fffffffffffffea8,
                            (Pathway *)CONCAT44(in_stack_fffffffffffffea4,local_170));
      }
      OpenSteer::Vec3::operator*
                ((Vec3 *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
                 in_stack_fffffffffffffddc);
      OpenSteer::Vec3::operator+=
                ((Vec3 *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                 (Vec3 *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
    }
  }
  VVar4 = OpenSteer::Vec3::setYtoZero(in_RDI);
  return VVar4;
}

Assistant:

Vec3 determineCombinedSteering (const float elapsedTime)
        {
            // move forward
            Vec3 steeringForce = forward();
            
            // probability that a lower priority behavior will be given a
            // chance to "drive" even if a higher priority behavior might
            // otherwise be triggered.
            const float leakThrough = 0.1f;
            
            // determine if obstacle avoidance is required
            Vec3 obstacleAvoidance;
            if (leakThrough < frandom01())
            {
                const float oTime = 6; // minTimeToCollision = 6 seconds
                                       // ------------------------------------ xxxcwr11-1-04 fixing steerToAvoid
                                       // just for testing
                                       //             obstacleAvoidance = steerToAvoidObstacles (oTime, gObstacles);
                                       //             obstacleAvoidance = steerToAvoidObstacle (oTime, gObstacle1);
                                       //             obstacleAvoidance = steerToAvoidObstacle (oTime, gObstacle3);
                obstacleAvoidance = steerToAvoidObstacles (oTime, gObstacles);
                // ------------------------------------ xxxcwr11-1-04 fixing steerToAvoid
            }
            
            // if obstacle avoidance is needed, do it
            if (obstacleAvoidance != Vec3::zero)
            {
                steeringForce += obstacleAvoidance;
            }
            else
            {
                // otherwise consider avoiding collisions with others
                Vec3 collisionAvoidance;
                const float caLeadTime = 3;
                
                // find all neighbors within maxRadius using proximity database
                // (radius is largest distance between vehicles traveling head-on
                // where a collision is possible within caLeadTime seconds.)
                const float maxRadius = caLeadTime * maxSpeed() * 2;
                neighbors.clear();
                proximityToken->findNeighbors (position(), maxRadius, neighbors);
                
                if (leakThrough < frandom01())
                    collisionAvoidance =
                        steerToAvoidNeighbors (caLeadTime, neighbors) * 10;
                
                // if collision avoidance is needed, do it
                if (collisionAvoidance != Vec3::zero)
                {
                    steeringForce += collisionAvoidance;
                }
                else
                {
                    // add in wander component (according to user switch)
                    if (gWanderSwitch)
                        steeringForce += steerForWander (elapsedTime);
                    
                    // do (interactively) selected type of path following
                    const float pfLeadTime = 3;
                    const Vec3 pathFollow =
                        (gUseDirectedPathFollowing ?
                         steerToFollowPath (pathDirection, pfLeadTime, *path) :
                         steerToStayOnPath (pfLeadTime, *path));
                    
                    // add in to steeringForce
                    steeringForce += pathFollow * 0.5;
                }
            }
            
            // return steering constrained to global XZ "ground" plane
            return steeringForce.setYtoZero ();
        }